

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix.h
# Opt level: O2

void chrono::StreamOUTdenseMatlabFormat(ChMatrixConstRef A,ChStreamOutAscii *stream)

{
  int jj;
  long col;
  int ii;
  long row;
  CoeffReturnType dVal;
  
  for (row = 0; row < (A->
                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      ).
                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_rows.m_value; row = row + 1) {
    for (col = 0; col < (A->
                        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        ).
                        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                        .m_cols.m_value; col = col + 1) {
      dVal = Eigen::
             DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
             ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           *)A,row,col);
      ChStreamOutAscii::operator<<(stream,dVal);
      if (col < (A->
                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value + -1) {
        ChStreamOutAscii::operator<<(stream," ");
      }
    }
    ChStreamOutAscii::operator<<(stream,"\n");
  }
  return;
}

Assistant:

inline void StreamOUTdenseMatlabFormat(ChMatrixConstRef A, ChStreamOutAscii& stream) {
    for (int ii = 0; ii < A.rows(); ii++) {
        for (int jj = 0; jj < A.cols(); jj++) {
            stream << A(ii, jj);
            if (jj < A.cols() - 1)
                stream << " ";
        }
        stream << "\n";
    }
}